

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O1

void __thiscall
ScenePreprocessorTest_testMeshPreprocessingPos_Test::TestBody
          (ScenePreprocessorTest_testMeshPreprocessingPos_Test *this)

{
  bool bVar1;
  aiMesh *p;
  undefined8 *puVar2;
  aiVector3D *paVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  p = (aiMesh *)operator_new(0x520);
  p->mPrimitiveTypes = 0;
  p->mNumVertices = 0;
  p->mNumFaces = 0;
  memset(&p->mVertices,0,0xcc);
  p->mBones = (aiBone **)0x0;
  p->mMaterialIndex = 0;
  (p->mName).length = 0;
  (p->mName).data[0] = '\0';
  memset((p->mName).data + 1,0x1b,0x3ff);
  p->mNumAnimMeshes = 0;
  p->mAnimMeshes = (aiAnimMesh **)0x0;
  p->mMethod = 0;
  (p->mAABB).mMin.x = 0.0;
  (p->mAABB).mMin.y = 0.0;
  (p->mAABB).mMin.z = 0.0;
  (p->mAABB).mMax.x = 0.0;
  (p->mAABB).mMax.y = 0.0;
  (p->mAABB).mMax.z = 0.0;
  p->mTextureCoords[0] = (aiVector3D *)0x0;
  p->mTextureCoords[1] = (aiVector3D *)0x0;
  p->mTextureCoords[2] = (aiVector3D *)0x0;
  p->mTextureCoords[3] = (aiVector3D *)0x0;
  p->mTextureCoords[4] = (aiVector3D *)0x0;
  p->mTextureCoords[5] = (aiVector3D *)0x0;
  p->mTextureCoords[6] = (aiVector3D *)0x0;
  p->mTextureCoords[7] = (aiVector3D *)0x0;
  p->mNumUVComponents[0] = 0;
  p->mNumUVComponents[1] = 0;
  p->mNumUVComponents[2] = 0;
  p->mNumUVComponents[3] = 0;
  p->mNumUVComponents[4] = 0;
  p->mNumUVComponents[5] = 0;
  p->mNumUVComponents[6] = 0;
  p->mNumUVComponents[7] = 0;
  p->mColors[0] = (aiColor4D *)0x0;
  p->mColors[1] = (aiColor4D *)0x0;
  p->mColors[2] = (aiColor4D *)0x0;
  p->mColors[3] = (aiColor4D *)0x0;
  p->mColors[4] = (aiColor4D *)0x0;
  p->mColors[5] = (aiColor4D *)0x0;
  p->mColors[6] = (aiColor4D *)0x0;
  p->mColors[7] = (aiColor4D *)0x0;
  p->mNumFaces = 100;
  puVar2 = (undefined8 *)operator_new__(0x648);
  *puVar2 = 100;
  lVar4 = 0x10;
  do {
    *(undefined4 *)((long)puVar2 + lVar4 + -8) = 0;
    *(undefined8 *)((long)puVar2 + lVar4) = 0;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x650);
  p->mFaces = (aiFace *)(puVar2 + 1);
  paVar3 = (aiVector3D *)operator_new__(0x78);
  paVar3->x = 0.0;
  paVar3->y = 0.0;
  *(undefined8 *)&paVar3->z = 0;
  paVar3[1].y = 0.0;
  paVar3[1].z = 0.0;
  paVar3[2].x = 0.0;
  paVar3[2].y = 0.0;
  *(undefined8 *)&paVar3[2].z = 0;
  paVar3[3].y = 0.0;
  paVar3[3].z = 0.0;
  paVar3[4].x = 0.0;
  paVar3[4].y = 0.0;
  *(undefined8 *)&paVar3[4].z = 0;
  paVar3[5].y = 0.0;
  paVar3[5].z = 0.0;
  paVar3[6].x = 0.0;
  paVar3[6].y = 0.0;
  *(undefined8 *)&paVar3[6].z = 0;
  paVar3[7].y = 0.0;
  paVar3[7].z = 0.0;
  paVar3[8].x = 0.0;
  paVar3[8].y = 0.0;
  *(undefined8 *)&paVar3[8].z = 0;
  uVar6 = 0;
  paVar3[9].y = 0.0;
  paVar3[9].z = 0.0;
  p->mTextureCoords[0] = paVar3;
  p->mNumUVComponents[0] = 0;
  p->mNumUVComponents[1] = 0;
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,1,1);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,2,2);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,3,4);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,4,8);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,0x4e1,8);
  if (1 < p->mNumFaces) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      *(undefined4 *)((long)&p->mFaces->mNumIndices + lVar4) = 3;
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar6 < p->mNumFaces >> 1);
  }
  if ((uint)uVar6 < p->mNumFaces - (p->mNumFaces >> 2)) {
    uVar6 = uVar6 & 0xffffffff;
    lVar4 = uVar6 << 4;
    do {
      *(undefined4 *)((long)&p->mFaces->mNumIndices + lVar4) = 4;
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar6 < p->mNumFaces - (p->mNumFaces >> 2));
  }
  if ((uint)uVar6 < p->mNumFaces) {
    uVar6 = uVar6 & 0xffffffff;
    lVar4 = uVar6 << 4;
    do {
      *(undefined4 *)((long)&p->mFaces->mNumIndices + lVar4) = 10;
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar6 < p->mNumFaces);
  }
  Assimp::ScenePreprocessor::ProcessMesh((this->super_ScenePreprocessorTest).mScenePreprocessor,p);
  local_48.ptr_._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_38,"static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON)",
             "p->mPrimitiveTypes",(uint *)&local_48,(uint *)p);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_38,"2U","p->mNumUVComponents[0]",(uint *)&local_48,p->mNumUVComponents);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ptr_ = local_48.ptr_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_38,"0U","p->mNumUVComponents[1]",(uint *)&local_48,p->mNumUVComponents + 1);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aiMesh::~aiMesh(p);
  operator_delete(p);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testMeshPreprocessingPos) {
    aiMesh* p = new aiMesh;
    p->mNumFaces = 100;
    p->mFaces = new aiFace[p->mNumFaces];

    p->mTextureCoords[0] = new aiVector3D[10];
    p->mNumUVComponents[0] = 0;
    p->mNumUVComponents[1] = 0;

    CheckIfOnly(p,1,aiPrimitiveType_POINT);
    CheckIfOnly(p,2,aiPrimitiveType_LINE);
    CheckIfOnly(p,3,aiPrimitiveType_TRIANGLE);
    CheckIfOnly(p,4,aiPrimitiveType_POLYGON);
    CheckIfOnly(p,1249,aiPrimitiveType_POLYGON);

    // Polygons and triangles mixed
    unsigned i;
    for (i = 0; i < p->mNumFaces/2;++i) {
        p->mFaces[i].mNumIndices = 3;
    }
    for (; i < p->mNumFaces-p->mNumFaces/4;++i) {
        p->mFaces[i].mNumIndices = 4;
    }
    for (; i < p->mNumFaces;++i)    {
        p->mFaces[i].mNumIndices = 10;
    }
    ProcessMesh(p);
    EXPECT_EQ(static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON),
              p->mPrimitiveTypes);
    EXPECT_EQ(2U, p->mNumUVComponents[0]);
    EXPECT_EQ(0U, p->mNumUVComponents[1]);
    delete p;
}